

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

lyd_node * lyd_new_dummy(lyd_node *root,lyd_node *parent,lys_node *schema,char *value,int dflt)

{
  lyd_node **pplVar1;
  LYS_NODE LVar2;
  lys_node *schema_00;
  uint uVar3;
  int iVar4;
  ly_set *set;
  lyd_node *node;
  LY_ERR *pLVar5;
  uint uVar6;
  lyd_node *plVar7;
  lyd_node *plVar8;
  ulong uVar9;
  
  if (schema == (lys_node *)0x0) {
    __assert_fail("schema",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x5ff,
                  "struct lyd_node *lyd_new_dummy(struct lyd_node *, struct lyd_node *, const struct lys_node *, const char *, int)"
                 );
  }
  if ((schema->nodetype & 0xc1bd) == LYS_UNKNOWN) {
    __assert_fail("schema->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF | LYS_RPC | LYS_ACTION)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x601,
                  "struct lyd_node *lyd_new_dummy(struct lyd_node *, struct lyd_node *, const struct lys_node *, const char *, int)"
                 );
  }
  set = (ly_set *)calloc(1,0x10);
  if (set == (ly_set *)0x0) {
    pLVar5 = ly_errno_location();
    *pLVar5 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_new_dummy");
    return (lyd_node *)0x0;
  }
  if (root != (lyd_node *)0x0 && parent == (lyd_node *)0x0) {
    do {
      pplVar1 = &root->parent;
      plVar8 = root;
      root = *pplVar1;
    } while (*pplVar1 != (lyd_node *)0x0);
    do {
      root = plVar8;
      plVar8 = root->prev;
    } while (root->prev->next != (lyd_node *)0x0);
  }
  do {
    if ((parent != (lyd_node *)0x0) && (parent->schema == schema)) {
      uVar9 = (ulong)set->number;
      if (set->number != 0) goto LAB_0015cb74;
      goto LAB_0015cd80;
    }
    if ((schema->nodetype & 0xc1bd) != LYS_UNKNOWN) {
      ly_set_add(set,schema,1);
    }
    schema = lys_parent(schema);
  } while (schema != (lys_node *)0x0);
  uVar6 = set->number;
  if (uVar6 == 0) {
LAB_0015cd80:
    __assert_fail("spath->number > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x61d,
                  "struct lyd_node *lyd_new_dummy(struct lyd_node *, struct lyd_node *, const struct lys_node *, const char *, int)"
                 );
  }
  if (parent == (lyd_node *)0x0) {
    uVar9 = (ulong)(uVar6 - 1);
    plVar8 = (lyd_node *)0x0;
    if ((((set->set).s[uVar9]->nodetype & LYS_LEAFLIST) == LYS_UNKNOWN) && (root != (lyd_node *)0x0)
       ) {
      plVar8 = (lyd_node *)0x0;
      do {
        parent = root;
        if (root->schema == (set->set).s[uVar9]) goto LAB_0015cb74;
        root = root->next;
      } while (root != (lyd_node *)0x0);
      goto LAB_0015cbbb;
    }
  }
  else {
    uVar9 = (ulong)uVar6;
LAB_0015cb74:
    plVar8 = parent;
    uVar6 = (uint)uVar9;
    if (uVar6 != 0) {
      do {
        uVar6 = (uint)uVar9;
        uVar3 = uVar6 - 1;
        if ((((set->set).s[uVar3]->nodetype & LYS_LEAFLIST) != LYS_UNKNOWN) ||
           (plVar7 = plVar8->child, plVar7 == (lyd_node *)0x0)) goto LAB_0015cbc6;
        while (plVar7->schema != (set->set).s[uVar3]) {
          plVar7 = plVar7->next;
          if (plVar7 == (lyd_node *)0x0) goto LAB_0015cbbb;
        }
        uVar9 = (ulong)uVar3;
        plVar8 = plVar7;
      } while (uVar3 != 0);
      uVar6 = 0;
    }
LAB_0015cbbb:
    if (uVar6 == 0) {
      plVar7 = (lyd_node *)0x0;
      goto LAB_0015cc94;
    }
  }
LAB_0015cbc6:
  uVar9 = (ulong)uVar6;
  plVar7 = (lyd_node *)0x0;
  do {
    schema_00 = (set->set).s[uVar9 - 1];
    LVar2 = schema_00->nodetype;
    if ((int)LVar2 < 0x10) {
      if (LVar2 == LYS_CONTAINER) goto LAB_0015cc2e;
      if ((LVar2 != LYS_LEAF) && (LVar2 != LYS_LEAFLIST)) goto LAB_0015ccce;
      if (value != (char *)0x0) {
        node = _lyd_new_leaf(plVar8,schema_00,value,dflt);
        goto LAB_0015cc3c;
      }
      node = lyd_create_leaf(schema_00,(char *)0x0,dflt);
      if ((node == (lyd_node *)0x0) || (plVar8 == (lyd_node *)0x0)) goto LAB_0015cc3c;
      iVar4 = lyd_insert(plVar8,node);
      plVar8 = node;
      if (iVar4 != 0) {
        lyd_free(node);
        goto LAB_0015ccce;
      }
    }
    else {
      if (LVar2 != LYS_LIST) {
        if ((LVar2 != LYS_ANYXML) && (LVar2 != LYS_ANYDATA)) goto LAB_0015ccce;
        node = lyd_create_anydata(plVar8,schema_00,"",LYD_ANYDATA_CONSTSTRING);
        goto LAB_0015cc3c;
      }
LAB_0015cc2e:
      node = _lyd_new(plVar8,schema_00,dflt);
LAB_0015cc3c:
      plVar8 = node;
      if (node == (lyd_node *)0x0) {
        pLVar5 = ly_errno_location();
        *pLVar5 = LY_EINT;
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
               ,0x652);
LAB_0015ccce:
        free((set->set).s);
        free(set);
        lyd_free(plVar7);
        return (lyd_node *)0x0;
      }
    }
    uVar9 = uVar9 - 1;
    plVar8->validity = 0x80;
    if (plVar7 == (lyd_node *)0x0) {
      plVar7 = plVar8;
    }
  } while (uVar9 != 0);
LAB_0015cc94:
  free((set->set).s);
  free(set);
  return plVar7;
}

Assistant:

struct lyd_node *
lyd_new_dummy(struct lyd_node *root, struct lyd_node *parent, const struct lys_node *schema, const char *value, int dflt)
{
    unsigned int index;
    struct ly_set *spath;
    const struct lys_node *siter;
    struct lyd_node *iter, *dummy = NULL;

    assert(schema);
    assert(schema->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF |
                               LYS_RPC | LYS_ACTION));

    spath = ly_set_new();
    if (!spath) {
        LOGMEM;
        return NULL;
    }

    if (!parent && root) {
        /* find data root */
        for (; root->parent; root = root->parent);   /* vertical move (up) */
        for (; root->prev->next; root = root->prev); /* horizontal move (left) */
    }

    /* build schema path */
    for (siter = schema; siter; siter = lys_parent(siter)) {
        /* stop if we know some of the parents */
        if (parent && parent->schema == siter) {
            break;
        }

        if (siter->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF |
                               LYS_RPC | LYS_ACTION)) {
            /* we have a node that can appear in data tree */
            ly_set_add(spath, (void*)siter, LY_SET_OPT_USEASLIST);
        } /* else skip the rest node types */
    }

    assert(spath->number > 0);
    index = spath->number;
    if (!parent && !(spath->set.s[index - 1]->nodetype & LYS_LEAFLIST)) {
        /* start by searching for the top-level parent */
        LY_TREE_FOR(root, iter) {
            if (iter->schema == spath->set.s[index - 1]) {
                parent = iter;
                index--;
                break;
            }
        }
    }

    iter = parent;
    while (iter && index && !(spath->set.s[index - 1]->nodetype & LYS_LEAFLIST)) {
        /* search for closer parent on the path */
        LY_TREE_FOR(parent->child, iter) {
            if (iter->schema == spath->set.s[index - 1]) {
                index--;
                parent = iter;
                break;
            }
        }
    }
    while(index) {
        /* create the missing part of the path */
        switch (spath->set.s[index - 1]->nodetype) {
        case LYS_LEAF:
        case LYS_LEAFLIST:
            if (value) {
                iter = _lyd_new_leaf(parent, spath->set.s[index - 1], value, dflt);
            } else {
                iter = lyd_create_leaf(spath->set.s[index - 1], value, dflt);
                if (iter && parent) {
                    if (lyd_insert(parent, iter)) {
                        lyd_free(iter);
                        goto error;
                    }
                }
            }
            break;
        case LYS_CONTAINER:
        case LYS_LIST:
            iter = _lyd_new(parent, spath->set.s[index - 1], dflt);
            break;
        case LYS_ANYXML:
        case LYS_ANYDATA:
            iter = lyd_create_anydata(parent, spath->set.s[index - 1], "", LYD_ANYDATA_CONSTSTRING);
            break;
        default:
            goto error;
        }
        if (!iter) {
            LOGINT;
            goto error;
        }

        /* we say it is valid and it is dummy */
        iter->validity = LYD_VAL_INUSE;

        if (!dummy) {
            dummy = iter;
        }

        /* continue */
        parent = iter;
        index--;
    }

    ly_set_free(spath);


    return dummy;

error:
    ly_set_free(spath);
    lyd_free(dummy);
    return NULL;
}